

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.h
# Opt level: O2

Point3<float> __thiscall pbrt::Transform::ApplyInverse<float>(Transform *this,Point3<float> *p)

{
  float fVar1;
  float fVar2;
  float fVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar11;
  Point3<float> PVar12;
  int vb;
  float va;
  
  fVar1 = (p->super_Tuple3<pbrt::Point3,_float>).y;
  fVar2 = (p->super_Tuple3<pbrt::Point3,_float>).x;
  fVar3 = (p->super_Tuple3<pbrt::Point3,_float>).z;
  auVar9 = vfmadd213ss_avx512f(ZEXT416((uint)(this->mInv).m[3][2]),ZEXT416((uint)fVar3),
                               ZEXT416((uint)(this->mInv).m[3][3]));
  auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * (this->mInv).m[3][1])),ZEXT416((uint)fVar2),
                            ZEXT416((uint)(this->mInv).m[3][0]));
  vaddss_avx512f(auVar10,auVar9);
  auVar10 = vxorps_avx512vl(auVar9,auVar9);
  auVar10 = vucomiss_avx512f(auVar10);
  fVar11 = auVar10._0_4_;
  auVar10 = vfmadd213ss_fma(ZEXT416((uint)(this->mInv).m[1][2]),ZEXT416((uint)fVar3),
                            ZEXT416((uint)(this->mInv).m[1][3]));
  auVar9 = vfmadd213ss_fma(ZEXT416((uint)(this->mInv).m[0][2]),ZEXT416((uint)fVar3),
                           ZEXT416((uint)(this->mInv).m[0][3]));
  auVar5 = vfmadd213ss_fma(ZEXT416((uint)(this->mInv).m[2][2]),ZEXT416((uint)fVar3),
                           ZEXT416((uint)(this->mInv).m[2][3]));
  bVar4 = fVar11 == 1.0;
  auVar6 = vfmadd213ss_fma(ZEXT416((uint)(this->mInv).m[1][0]),ZEXT416((uint)fVar2),
                           ZEXT416((uint)((this->mInv).m[1][1] * fVar1)));
  auVar7 = vfmadd213ss_fma(ZEXT416((uint)(this->mInv).m[0][0]),ZEXT416((uint)fVar2),
                           ZEXT416((uint)(fVar1 * (this->mInv).m[0][1])));
  auVar8 = vfmadd213ss_fma(ZEXT416((uint)(this->mInv).m[2][0]),ZEXT416((uint)fVar2),
                           ZEXT416((uint)((this->mInv).m[2][1] * fVar1)));
  fVar1 = auVar7._0_4_ + auVar9._0_4_;
  fVar2 = auVar6._0_4_ + auVar10._0_4_;
  fVar3 = auVar8._0_4_ + auVar5._0_4_;
  auVar10 = vinsertps_avx(ZEXT416((uint)bVar4 * (int)fVar1 + (uint)!bVar4 * (int)(fVar1 / fVar11)),
                          ZEXT416((uint)bVar4 * (int)fVar2 + (uint)!bVar4 * (int)(fVar2 / fVar11)),
                          0x10);
  PVar12.super_Tuple3<pbrt::Point3,_float>._0_8_ = auVar10._0_8_;
  PVar12.super_Tuple3<pbrt::Point3,_float>.z =
       (float)((uint)bVar4 * (int)fVar3 + (uint)!bVar4 * (int)(fVar3 / fVar11));
  return (Point3<float>)PVar12.super_Tuple3<pbrt::Point3,_float>;
}

Assistant:

inline Point3<T> Transform::ApplyInverse(const Point3<T> &p) const {
    T x = p.x, y = p.y, z = p.z;
    T xp = (mInv[0][0] * x + mInv[0][1] * y) + (mInv[0][2] * z + mInv[0][3]);
    T yp = (mInv[1][0] * x + mInv[1][1] * y) + (mInv[1][2] * z + mInv[1][3]);
    T zp = (mInv[2][0] * x + mInv[2][1] * y) + (mInv[2][2] * z + mInv[2][3]);
    T wp = (mInv[3][0] * x + mInv[3][1] * y) + (mInv[3][2] * z + mInv[3][3]);
    CHECK_NE(wp, 0);
    if (wp == 1)
        return Point3<T>(xp, yp, zp);
    else
        return Point3<T>(xp, yp, zp) / wp;
}